

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O3

int run_test_fork_socketpair_started(void)

{
  int iVar1;
  __pid_t child_pid;
  uint uVar2;
  undefined8 uVar3;
  ssize_t sVar4;
  int in_ESI;
  undefined1 *puVar5;
  char sync_buf [1];
  int socket_fds [2];
  int sync_pipe [2];
  uv_poll_t poll_handle;
  undefined1 local_b9;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  undefined1 local_a8 [160];
  
  iVar1 = pipe(&local_b0);
  if (iVar1 == 0) {
    run_timer_loop_once();
    in_ESI = 1;
    iVar1 = socketpair(1,1,0,&local_b8);
    if (iVar1 != 0) goto LAB_0014f22d;
    uVar3 = uv_default_loop();
    puVar5 = local_a8;
    iVar1 = uv_poll_init(uVar3,puVar5,local_b8);
    in_ESI = (int)puVar5;
    if (iVar1 != 0) goto LAB_0014f232;
    in_ESI = 1;
    iVar1 = uv_poll_start(local_a8,1,socket_cb);
    if (iVar1 != 0) goto LAB_0014f237;
    uVar3 = uv_default_loop();
    in_ESI = 2;
    iVar1 = uv_run(uVar3);
    if (iVar1 != 1) goto LAB_0014f23c;
    child_pid = fork();
    if (child_pid != 0) {
      if (child_pid == -1) goto LAB_0014f246;
      iVar1 = uv_poll_stop(local_a8);
      if (iVar1 != 0) goto LAB_0014f24b;
      uv_close(local_a8);
      uVar3 = uv_default_loop();
      in_ESI = 0;
      iVar1 = uv_run(uVar3);
      if (iVar1 != 0) goto LAB_0014f255;
      if (socket_cb_called != 0) goto LAB_0014f25f;
      in_ESI = 0x18323c;
      sVar4 = write(local_ac,"1",1);
      if (sVar4 != 1) goto LAB_0014f269;
      in_ESI = 0x18271a;
      sVar4 = send(local_b4,"hi\n",3,0);
      if (sVar4 != 3) goto LAB_0014f273;
      uVar3 = uv_default_loop();
      in_ESI = 0;
      iVar1 = uv_run(uVar3);
      if (iVar1 == 0) {
        if (socket_cb_called != 0) goto LAB_0014f287;
        assert_wait_child(child_pid);
        goto LAB_0014f1e9;
      }
      goto LAB_0014f27d;
    }
    uVar2 = getpid();
    printf("Child is %d\n",(ulong)uVar2);
    puVar5 = &local_b9;
    sVar4 = read(local_b0,puVar5,1);
    in_ESI = (int)puVar5;
    if (sVar4 != 1) goto LAB_0014f250;
    uVar3 = uv_default_loop();
    iVar1 = uv_loop_fork(uVar3);
    if (iVar1 != 0) goto LAB_0014f25a;
    if (socket_cb_called != 0) goto LAB_0014f264;
    puts("Going to run the loop in the child");
    socket_cb_read_fd = local_b8;
    socket_cb_read_size = 1;
    uVar3 = uv_default_loop();
    in_ESI = 0;
    iVar1 = uv_run(uVar3);
    if (iVar1 != 0) goto LAB_0014f26e;
    if (socket_cb_called != 1) goto LAB_0014f278;
    in_ESI = 0x2e0290;
    printf("Buf %s\n");
    if (socket_cb_read_buf._0_4_ == 0xa6968) {
LAB_0014f1e9:
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      in_ESI = 0;
      uv_run(uVar3);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0014f241;
    }
  }
  else {
    run_test_fork_socketpair_started_cold_1();
LAB_0014f22d:
    run_test_fork_socketpair_started_cold_2();
LAB_0014f232:
    run_test_fork_socketpair_started_cold_3();
LAB_0014f237:
    run_test_fork_socketpair_started_cold_4();
LAB_0014f23c:
    run_test_fork_socketpair_started_cold_5();
LAB_0014f241:
    run_test_fork_socketpair_started_cold_20();
LAB_0014f246:
    run_test_fork_socketpair_started_cold_12();
LAB_0014f24b:
    run_test_fork_socketpair_started_cold_13();
LAB_0014f250:
    run_test_fork_socketpair_started_cold_6();
LAB_0014f255:
    run_test_fork_socketpair_started_cold_14();
LAB_0014f25a:
    run_test_fork_socketpair_started_cold_7();
LAB_0014f25f:
    run_test_fork_socketpair_started_cold_15();
LAB_0014f264:
    run_test_fork_socketpair_started_cold_8();
LAB_0014f269:
    run_test_fork_socketpair_started_cold_16();
LAB_0014f26e:
    run_test_fork_socketpair_started_cold_9();
LAB_0014f273:
    run_test_fork_socketpair_started_cold_17();
LAB_0014f278:
    run_test_fork_socketpair_started_cold_10();
LAB_0014f27d:
    run_test_fork_socketpair_started_cold_18();
  }
  run_test_fork_socketpair_started_cold_11();
LAB_0014f287:
  run_test_fork_socketpair_started_cold_19();
  fork_signal_cb_called = in_ESI;
  iVar1 = uv_close();
  return iVar1;
}

Assistant:

TEST_IMPL(fork_socketpair_started) {
  /* A socket opened in the parent and accept'd in the
     child works after a fork, even if the watcher was already
     started, and then stopped in the parent. */
  pid_t child_pid;
  int socket_fds[2];
  int sync_pipe[2];
  char sync_buf[1];
  uv_poll_t poll_handle;

  ASSERT(0 == pipe(sync_pipe));

  /* Prime the loop. */
  run_timer_loop_once();

  ASSERT(0 == socketpair(AF_UNIX, SOCK_STREAM, 0, socket_fds));

  /* Create and start the server watcher in the parent, use it in the child. */
  ASSERT(0 == uv_poll_init(uv_default_loop(), &poll_handle, socket_fds[0]));
  ASSERT(0 == uv_poll_start(&poll_handle, UV_READABLE, socket_cb));

  /* Run the loop AFTER the poll watcher is registered to make sure it
     gets passed to the kernel. Use NOWAIT and expect a non-zero
     return to prove the poll watcher is active.
  */
  ASSERT(1 == uv_run(uv_default_loop(), UV_RUN_NOWAIT));

  child_pid = fork();
  ASSERT(child_pid != -1);

  if (child_pid != 0) {
    /* parent */
    ASSERT(0 == uv_poll_stop(&poll_handle));
    uv_close((uv_handle_t*)&poll_handle, NULL);
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
    ASSERT(0 == socket_cb_called);
    ASSERT(1 == write(sync_pipe[1], "1", 1)); /* alert child */
    ASSERT(3 == send(socket_fds[1], "hi\n", 3, 0));

    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
    ASSERT(0 == socket_cb_called);

    assert_wait_child(child_pid);
  } else {
    /* child */
    printf("Child is %d\n", getpid());
    ASSERT(1 == read(sync_pipe[0], sync_buf, 1)); /* wait for parent */
    ASSERT(0 == uv_loop_fork(uv_default_loop()));
    ASSERT(0 == socket_cb_called);

    printf("Going to run the loop in the child\n");
    socket_cb_read_fd = socket_fds[0];
    socket_cb_read_size = 3;
    ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
    ASSERT(1 == socket_cb_called);
    printf("Buf %s\n", socket_cb_read_buf);
    ASSERT(0 == strcmp("hi\n", socket_cb_read_buf));
  }

  MAKE_VALGRIND_HAPPY();
  return 0;
}